

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O2

char * max_expand(MatchState *ms,char *s,char *p,char *ep)

{
  byte *pbVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  
  pbVar1 = (byte *)ms->src_end;
  lVar4 = 0;
  while ((s + lVar4 < pbVar1 && (iVar2 = singlematch((uint)(byte)s[lVar4],p,ep), iVar2 != 0))) {
    lVar4 = lVar4 + 1;
  }
  do {
    if (lVar4 < 0) {
      return (char *)0x0;
    }
    pcVar3 = match(ms,s + lVar4,ep + 1);
    lVar4 = lVar4 + -1;
  } while (pcVar3 == (char *)0x0);
  return pcVar3;
}

Assistant:

static const char *max_expand(MatchState *ms, const char *s,
			      const char *p, const char *ep)
{
  ptrdiff_t i = 0;  /* counts maximum expand for item */
  while ((s+i)<ms->src_end && singlematch(uchar(*(s+i)), p, ep))
    i++;
  /* keeps trying to match with the maximum repetitions */
  while (i>=0) {
    const char *res = match(ms, (s+i), ep+1);
    if (res) return res;
    i--;  /* else didn't match; reduce 1 repetition to try again */
  }
  return NULL;
}